

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcHeatExchangerType::IfcHeatExchangerType(IfcHeatExchangerType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_008f50b0;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcHeatExchangerType";
  Schema_2x3::IfcEnergyConversionDeviceType::IfcEnergyConversionDeviceType
            (&this->super_IfcEnergyConversionDeviceType,&PTR_construction_vtable_24__00997b08);
  *(undefined8 *)&(this->super_IfcEnergyConversionDeviceType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x997988;
  *(undefined8 *)&this->field_0x1e0 = 0x997af0;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x9979b0;
  (this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x9979d8;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x997a00;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x997a28;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x997a50;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x997a78;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x997aa0;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.field_0x1b0 =
       0x997ac8;
  *(undefined1 **)&(this->super_IfcEnergyConversionDeviceType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcHeatExchangerType() : Object("IfcHeatExchangerType") {}